

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall SQCompilation::CheckerVisitor::checkForgotSubst(CheckerVisitor *this,LiteralExpr *l)

{
  char cVar1;
  TreeOp TVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  Expr *pEVar7;
  LiteralExpr *pLVar8;
  pointer pSVar9;
  Node *pNVar10;
  bool bVar11;
  
  if (this->effectsOnly != false) {
    return;
  }
  if (l->_kind != LK_STRING) {
    return;
  }
  pSVar9 = (this->nodeStack).
           super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while ((pNVar10 = (Node *)0x0,
         pSVar9 != (this->nodeStack).
                   super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                   ._M_impl.super__Vector_impl_data._M_start &&
         ((pSVar9[-1].sst != SST_NODE || (pNVar10 = pSVar9[-1].field_1.n, pNVar10->_op != TO_CALL)))
         )) {
    pSVar9 = pSVar9 + -1;
  }
  pcVar6 = (l->_v).s;
  pcVar4 = strchr(pcVar6,0x7b);
  if (pcVar4 == (char *)0x0) {
    return;
  }
  cVar1 = pcVar4[1];
  iVar3 = isalpha((int)cVar1);
  if ((cVar1 != 0x5f) && (iVar3 == 0)) {
    return;
  }
  pcVar5 = strstr(pcVar6,":i=");
  if (pcVar5 != (char *)0x0) {
    return;
  }
  pcVar5 = strstr(pcVar6,":r=");
  if (pcVar5 != (char *)0x0) {
    return;
  }
  pcVar5 = strstr(pcVar6,":t=");
  if (pcVar5 != (char *)0x0) {
    return;
  }
  pcVar5 = strstr(pcVar6,":p2=");
  if (pcVar5 != (char *)0x0) {
    return;
  }
  pcVar5 = strstr(pcVar6,":p3=");
  if (pcVar5 != (char *)0x0) {
    return;
  }
  pcVar6 = strstr(pcVar6,":tm=");
  if (cVar1 == '\0') {
    return;
  }
  if (pcVar6 != (char *)0x0) {
    return;
  }
  pcVar6 = strchr(pcVar4 + 2,0x7d);
  if (pcVar6 == (char *)0x0) {
    return;
  }
  if (pNVar10 == (Node *)0x0) goto LAB_001515d6;
  pEVar7 = deparen((Expr *)pNVar10[1].super_ArenaObj._vptr_ArenaObj);
  TVar2 = (pEVar7->super_Node)._op;
  if (TVar2 == TO_ID) {
    iVar3 = strcmp("loc",(char *)pEVar7[1].super_Node.super_ArenaObj._vptr_ArenaObj);
    if ((iVar3 != 0) || (pNVar10[1]._op < TO_WHILE)) goto LAB_001515d6;
    pEVar7 = *(Expr **)(*(long *)&pNVar10[1]._coordinates.lineEnd + 8);
LAB_001515b0:
    pLVar8 = (LiteralExpr *)deparen(pEVar7);
    bVar11 = pLVar8 == l;
  }
  else {
    if (TVar2 != TO_GETFIELD) goto LAB_001515d6;
    pcVar6 = *(char **)&pEVar7[1].super_Node._coordinates.lineEnd;
    pLVar8 = (LiteralExpr *)deparen((Expr *)pEVar7[1].super_Node.super_ArenaObj._vptr_ArenaObj);
    if (pLVar8 != l) {
      iVar3 = strcmp(pcVar6,"split");
      if ((iVar3 != 0) || (pNVar10[1]._op == TO_BLOCK)) goto LAB_001515d6;
      pEVar7 = (Expr *)**(undefined8 **)&pNVar10[1]._coordinates.lineEnd;
      goto LAB_001515b0;
    }
    iVar3 = strcmp(pcVar6,"subst");
    bVar11 = iVar3 == 0;
  }
  if (bVar11) {
    return;
  }
LAB_001515d6:
  report(this,(Node *)l,0x6f);
  return;
}

Assistant:

void CheckerVisitor::checkForgotSubst(const LiteralExpr *l) {
  if (effectsOnly)
    return;

  if (l->kind() != LK_STRING)
    return;

  const CallExpr *candidate = nullptr;

  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst != SST_NODE)
      continue;

    const Node *n = it->n;

    if (n->op() == TO_CALL) {
      candidate = static_cast<const CallExpr *>(n);
      break;
    }
  }

  const SQChar *s = l->s();
  if (!stringLooksLikeFormatTemplate(s)) {
    return;
  }

  bool ok = false;

  if (candidate) {
    const Expr *callee = deparen(candidate->callee());
    const auto &arguments = candidate->arguments();
    if (callee->op() == TO_GETFIELD) { // -V522
      const GetFieldExpr *f = callee->asGetField();
      const SQChar *funcName = f->fieldName();
      if (deparen(f->receiver()) == l) {
        ok = strcmp(funcName, "subst") == 0;
      } else if (strcmp(funcName, "split") == 0) {
        ok = arguments.size() >= 1 && deparen(arguments[0]) == l;;
      }
    }
    else if (callee->op() == TO_ID) { // -V522
      if (strcmp("loc", callee->asId()->id()) == 0) {
        ok = arguments.size() >= 2 && deparen(arguments[1]) == l;
      }
    }
  }

  if (!ok)
    report(l, DiagnosticsId::DI_FORGOT_SUBST);
}